

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

void LatencyDumpDefaultImpl::addDumpTitle(stringstream *ss,size_t max_name_len)

{
  _Setw _Var1;
  ostream *poVar2;
  int in_ESI;
  long in_RDI;
  
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)(in_RDI + 0x10),std::left);
  _Var1 = std::setw(in_ESI);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,"STAT NAME");
  std::operator<<(poVar2,": ");
  std::ostream::operator<<((ostream *)(in_RDI + 0x10),std::right);
  _Var1 = std::setw(8);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  poVar2 = std::operator<<(poVar2,"TOTAL");
  std::operator<<(poVar2," ");
  _Var1 = std::setw(7);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  poVar2 = std::operator<<(poVar2,"RATIO");
  std::operator<<(poVar2," ");
  _Var1 = std::setw(6);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  poVar2 = std::operator<<(poVar2,"CALLS");
  std::operator<<(poVar2," ");
  _Var1 = std::setw(8);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  poVar2 = std::operator<<(poVar2,"AVERAGE");
  std::operator<<(poVar2," ");
  _Var1 = std::setw(8);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  poVar2 = std::operator<<(poVar2,"p50");
  std::operator<<(poVar2," ");
  _Var1 = std::setw(8);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  poVar2 = std::operator<<(poVar2,"p99");
  std::operator<<(poVar2," ");
  _Var1 = std::setw(8);
  poVar2 = std::operator<<((ostream *)(in_RDI + 0x10),_Var1);
  std::operator<<(poVar2,"p99.9");
  std::ostream::operator<<((ostream *)(in_RDI + 0x10),std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void addDumpTitle(std::stringstream& ss, size_t max_name_len) {
        ss << std::left << std::setw(max_name_len) << "STAT NAME" << ": ";
        ss << std::right;
        ss << std::setw(8) << "TOTAL" << " ";
        ss << std::setw(7) << "RATIO" << " ";
        ss << std::setw(6) << "CALLS" << " ";
        ss << std::setw(8) << "AVERAGE" << " ";
        ss << std::setw(8) << "p50" << " ";
        ss << std::setw(8) << "p99" << " ";
        ss << std::setw(8) << "p99.9";
        ss << std::endl;
    }